

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

void sysbvm_tuple_byteSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex,uint8_t value)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = tuple == 0;
  bVar3 = (tuple & 0xf) != 0;
  if (bVar3 || bVar2) {
    sysbvm_error_modifyImmediateValue();
  }
  else if ((*(byte *)(tuple + 8) & 0x80) != 0) {
    sysbvm_error_accessDummyValue();
  }
  if ((tuple & 0xf) != 0) {
    sysbvm_error_modifyImmutableTuple();
  }
  if ((bVar3 || bVar2) || ((*(uint *)(tuple + 8) & 0x300) != 0x200)) {
    sysbvm_error("Expected a byte tuple.");
  }
  if (bVar3 || bVar2) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)*(uint *)(tuple + 0xc);
  }
  if (slotIndex < uVar1) {
    *(uint8_t *)(tuple + 0x10 + slotIndex) = value;
    return;
  }
  sysbvm_error_outOfBoundsSlotAccess();
  return;
}

Assistant:

SYSBVM_API void sysbvm_tuple_byteSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex, uint8_t value)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();
    if(sysbvm_tuple_isImmediate(tuple)) sysbvm_error_modifyImmutableTuple();

    if(!sysbvm_tuple_isBytes(tuple))
        sysbvm_error("Expected a byte tuple.");

    if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
        SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex] = value;
    else
        sysbvm_error_outOfBoundsSlotAccess();
}